

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O2

void __thiscall
absl::strings_internal::
SplitIterator<absl::strings_internal::Splitter<absl::ByAnyChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
::SplitIterator(SplitIterator<absl::strings_internal::Splitter<absl::ByAnyChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *this,State state,
               Splitter<absl::ByAnyChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
               *splitter)

{
  size_t sVar1;
  
  this->pos_ = 0;
  this->state_ = state;
  (this->curr_)._M_len = 0;
  (this->curr_)._M_str = (char *)0x0;
  this->splitter_ = splitter;
  std::__cxx11::string::string((string *)&this->delimiter_,(string *)&splitter->delimiter_);
  sVar1 = (this->splitter_->text_)._M_len;
  if ((this->splitter_->text_)._M_str == (char *)0x0) {
    this->state_ = kEndState;
  }
  else if (this->state_ != kEndState) {
    operator++(this);
    return;
  }
  this->pos_ = sVar1;
  return;
}

Assistant:

SplitIterator(State state, const Splitter* splitter)
      : pos_(0),
        state_(state),
        splitter_(splitter),
        delimiter_(splitter->delimiter()),
        predicate_(splitter->predicate()) {
    // Hack to maintain backward compatibility. This one block makes it so an
    // empty absl::string_view whose .data() happens to be nullptr behaves
    // *differently* from an otherwise empty absl::string_view whose .data() is
    // not nullptr. This is an undesirable difference in general, but this
    // behavior is maintained to avoid breaking existing code that happens to
    // depend on this old behavior/bug. Perhaps it will be fixed one day. The
    // difference in behavior is as follows:
    //   Split(absl::string_view(""), '-');  // {""}
    //   Split(absl::string_view(), '-');    // {}
    if (splitter_->text().data() == nullptr) {
      state_ = kEndState;
      pos_ = splitter_->text().size();
      return;
    }

    if (state_ == kEndState) {
      pos_ = splitter_->text().size();
    } else {
      ++(*this);
    }
  }